

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O3

int FFont::SimpleTranslation(BYTE *colorsused,BYTE *translation,BYTE *reverse,double **luminosity)

{
  PalEntry PVar1;
  long lVar2;
  double *pdVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  memset(translation,0,0x100);
  *reverse = '\0';
  uVar6 = 1;
  lVar2 = 1;
  do {
    if (colorsused[lVar2] != '\0') {
      lVar4 = (long)(int)uVar6;
      uVar6 = uVar6 + 1;
      reverse[lVar4] = (BYTE)lVar2;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x100);
  uVar7 = 1;
  qsort(reverse + 1,(long)(int)(uVar6 - 1),1,compare);
  uVar5 = 0xffffffffffffffff;
  if (-1 < (int)uVar6) {
    uVar5 = (long)(int)uVar6 * 8;
  }
  pdVar3 = (double *)operator_new__(uVar5);
  *luminosity = pdVar3;
  *pdVar3 = 0.0;
  if (1 < (int)uVar6) {
    dVar8 = 100000000.0;
    dVar10 = 0.0;
    do {
      translation[reverse[uVar7]] = (BYTE)uVar7;
      PVar1.field_0 =
           (anon_union_4_2_12391d7c_for_PalEntry_0)GPalette.BaseColors[reverse[uVar7]].field_0.d;
      dVar9 = (double)((uint)PVar1.field_0 & 0xff) * 0.114 +
              (double)((uint)PVar1.field_0 >> 8 & 0xff) * 0.587 +
              (double)((uint)PVar1.field_0 >> 0x10 & 0xff) * 0.299;
      pdVar3 = *luminosity;
      pdVar3[uVar7] = dVar9;
      dVar11 = dVar9;
      if (dVar9 <= dVar10) {
        dVar11 = dVar10;
      }
      if (dVar8 <= dVar9) {
        dVar9 = dVar8;
      }
      uVar7 = uVar7 + 1;
      dVar8 = dVar9;
      dVar10 = dVar11;
    } while (uVar6 != uVar7);
    if (1 < (int)uVar6) {
      uVar5 = 1;
      do {
        pdVar3[uVar5] = (pdVar3[uVar5] - dVar9) * (1.0 / (dVar11 - dVar9));
        uVar5 = uVar5 + 1;
      } while (uVar6 != uVar5);
    }
  }
  return uVar6;
}

Assistant:

int FFont::SimpleTranslation (BYTE *colorsused, BYTE *translation, BYTE *reverse, double **luminosity)
{
	double min, max, diver;
	int i, j;

	memset (translation, 0, 256);

	reverse[0] = 0;
	for (i = 1, j = 1; i < 256; i++)
	{
		if (colorsused[i])
		{
			reverse[j++] = i;
		}
	}

	qsort (reverse+1, j-1, 1, compare);

	*luminosity = new double[j];
	(*luminosity)[0] = 0.0; // [BL] Prevent uninitalized memory
	max = 0.0;
	min = 100000000.0;
	for (i = 1; i < j; i++)
	{
		translation[reverse[i]] = i;

		(*luminosity)[i] = RPART(GPalette.BaseColors[reverse[i]]) * 0.299 +
						   GPART(GPalette.BaseColors[reverse[i]]) * 0.587 +
						   BPART(GPalette.BaseColors[reverse[i]]) * 0.114;
		if ((*luminosity)[i] > max)
			max = (*luminosity)[i];
		if ((*luminosity)[i] < min)
			min = (*luminosity)[i];
	}
	diver = 1.0 / (max - min);
	for (i = 1; i < j; i++)
	{
		(*luminosity)[i] = ((*luminosity)[i] - min) * diver;
	}

	return j;
}